

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_base.c
# Opt level: O3

int lj_ffh_pcall(lua_State *L)

{
  TValue *pTVar1;
  
  pTVar1 = L->base;
  if (L->top <= pTVar1) {
    lj_err_arg(L,1,LJ_ERR_NOVAL);
  }
  if ((pTVar1 + 1 < L->top) && (*(int *)((long)pTVar1 + 0xc) == -9)) {
    return 0;
  }
  lj_err_argt(L,2,6);
}

Assistant:

LJLIB_ASM(pcall)		LJLIB_REC(.)
{
  lj_lib_checkany(L, 1);
  lj_lib_checkfunc(L, 2);  /* For xpcall only. */
  return FFH_UNREACHABLE;
}